

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined4 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined4 uVar47;
  uint uVar48;
  long lVar49;
  ulong uVar50;
  ulong *puVar51;
  ulong *puVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  uint uVar57;
  ulong unaff_R13;
  size_t mask;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  bool bVar61;
  float fVar62;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar69;
  float fVar73;
  float fVar75;
  float fVar77;
  undefined1 auVar64 [32];
  float fVar71;
  undefined1 auVar65 [32];
  uint uVar68;
  uint uVar70;
  uint uVar72;
  uint uVar74;
  uint uVar76;
  uint uVar78;
  uint uVar79;
  undefined1 auVar66 [32];
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  vint4 ai;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar97 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 in_ZMM14 [64];
  undefined1 auVar144 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar145 [64];
  NodeRef stack [244];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar47 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar92._4_4_ = uVar47;
  auVar92._0_4_ = uVar47;
  auVar92._8_4_ = uVar47;
  auVar92._12_4_ = uVar47;
  uVar47 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar95._4_4_ = uVar47;
  auVar95._0_4_ = uVar47;
  auVar95._8_4_ = uVar47;
  auVar95._12_4_ = uVar47;
  uVar47 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar97._4_4_ = uVar47;
  auVar97._0_4_ = uVar47;
  auVar97._8_4_ = uVar47;
  auVar97._12_4_ = uVar47;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar113._4_4_ = fVar3;
  auVar113._0_4_ = fVar3;
  auVar113._8_4_ = fVar3;
  auVar113._12_4_ = fVar3;
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar4 = (tray->tnear).field_0.i[k];
  auVar116._4_4_ = iVar4;
  auVar116._0_4_ = iVar4;
  auVar116._8_4_ = iVar4;
  auVar116._12_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar119._4_4_ = iVar4;
  auVar119._0_4_ = iVar4;
  auVar119._8_4_ = iVar4;
  auVar119._12_4_ = iVar4;
  puVar52 = local_7f8;
  do {
    puVar51 = puVar52;
    auVar115 = ZEXT1664(auVar113);
    if (puVar51 == &local_800) break;
    puVar52 = puVar51 + -1;
    uVar60 = puVar51[-1];
    do {
      if ((uVar60 & 8) == 0) {
        auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar50),auVar92);
        auVar89._0_4_ = fVar1 * auVar63._0_4_;
        auVar89._4_4_ = fVar1 * auVar63._4_4_;
        auVar89._8_4_ = fVar1 * auVar63._8_4_;
        auVar89._12_4_ = fVar1 * auVar63._12_4_;
        auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar54),auVar95);
        auVar80._0_4_ = fVar2 * auVar63._0_4_;
        auVar80._4_4_ = fVar2 * auVar63._4_4_;
        auVar80._8_4_ = fVar2 * auVar63._8_4_;
        auVar80._12_4_ = fVar2 * auVar63._12_4_;
        auVar63 = vpmaxsd_avx(auVar89,auVar80);
        auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar55),auVar97);
        auVar81._0_4_ = fVar3 * auVar89._0_4_;
        auVar81._4_4_ = fVar3 * auVar89._4_4_;
        auVar81._8_4_ = fVar3 * auVar89._8_4_;
        auVar81._12_4_ = fVar3 * auVar89._12_4_;
        auVar89 = vpmaxsd_avx(auVar81,auVar116);
        auVar63 = vpmaxsd_avx(auVar63,auVar89);
        auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar50 ^ 0x10)),auVar92);
        auVar82._0_4_ = fVar1 * auVar89._0_4_;
        auVar82._4_4_ = fVar1 * auVar89._4_4_;
        auVar82._8_4_ = fVar1 * auVar89._8_4_;
        auVar82._12_4_ = fVar1 * auVar89._12_4_;
        auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar54 ^ 0x10)),auVar95);
        auVar87._0_4_ = fVar2 * auVar89._0_4_;
        auVar87._4_4_ = fVar2 * auVar89._4_4_;
        auVar87._8_4_ = fVar2 * auVar89._8_4_;
        auVar87._12_4_ = fVar2 * auVar89._12_4_;
        auVar89 = vpminsd_avx(auVar82,auVar87);
        auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar55 ^ 0x10)),auVar97);
        auVar88._0_4_ = fVar3 * auVar80._0_4_;
        auVar88._4_4_ = fVar3 * auVar80._4_4_;
        auVar88._8_4_ = fVar3 * auVar80._8_4_;
        auVar88._12_4_ = fVar3 * auVar80._12_4_;
        auVar80 = vpminsd_avx(auVar88,auVar119);
        auVar89 = vpminsd_avx(auVar89,auVar80);
        auVar63 = vpcmpgtd_avx(auVar63,auVar89);
        uVar47 = vmovmskps_avx(auVar63);
        unaff_R13 = (ulong)(byte)((byte)uVar47 ^ 0xf);
      }
      if ((uVar60 & 8) == 0) {
        if (unaff_R13 == 0) {
          uVar57 = 4;
        }
        else {
          uVar59 = uVar60 & 0xfffffffffffffff0;
          lVar56 = 0;
          if (unaff_R13 != 0) {
            for (; (unaff_R13 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          uVar57 = 0;
          uVar60 = *(ulong *)(uVar59 + lVar56 * 8);
          uVar58 = unaff_R13 - 1 & unaff_R13;
          if (uVar58 != 0) {
            *puVar52 = uVar60;
            lVar56 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
              }
            }
            uVar53 = uVar58 - 1;
            while( true ) {
              puVar52 = puVar52 + 1;
              uVar60 = *(ulong *)(uVar59 + lVar56 * 8);
              uVar53 = uVar53 & uVar58;
              if (uVar53 == 0) break;
              *puVar52 = uVar60;
              lVar56 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                }
              }
              uVar58 = uVar53 - 1;
            }
          }
        }
      }
      else {
        uVar57 = 6;
      }
    } while (uVar57 == 0);
    if (uVar57 == 6) {
      uVar59 = (ulong)((uint)uVar60 & 0xf);
      uVar57 = 0;
      uVar58 = uVar59 - 8;
      bVar61 = uVar59 != 8;
      if (bVar61) {
        uVar47 = *(undefined4 *)(ray + k * 4);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
        fVar7 = *(float *)(ray + k * 4 + 0x80);
        fVar8 = *(float *)(ray + k * 4 + 0xa0);
        uVar60 = uVar60 & 0xfffffffffffffff0;
        fVar9 = *(float *)(ray + k * 4 + 0xc0);
        uVar59 = 0;
        do {
          lVar49 = uVar59 * 0xe0;
          lVar56 = uVar60 + 0xc0 + lVar49;
          local_820 = *(undefined8 *)(lVar56 + 0x10);
          uStack_818 = *(undefined8 *)(lVar56 + 0x18);
          uStack_810 = local_820;
          uStack_808 = uStack_818;
          auVar105._16_16_ = *(undefined1 (*) [16])(uVar60 + 0x60 + lVar49);
          auVar105._0_16_ = *(undefined1 (*) [16])(uVar60 + lVar49);
          auVar122._16_16_ = *(undefined1 (*) [16])(uVar60 + 0x70 + lVar49);
          auVar122._0_16_ = *(undefined1 (*) [16])(uVar60 + 0x10 + lVar49);
          auVar130._16_16_ = *(undefined1 (*) [16])(uVar60 + 0x80 + lVar49);
          auVar130._0_16_ = *(undefined1 (*) [16])(uVar60 + 0x20 + lVar49);
          auVar63 = *(undefined1 (*) [16])(uVar60 + 0x30 + lVar49);
          auVar64._16_16_ = auVar63;
          auVar64._0_16_ = auVar63;
          auVar63 = *(undefined1 (*) [16])(uVar60 + 0x40 + lVar49);
          auVar83._16_16_ = auVar63;
          auVar83._0_16_ = auVar63;
          auVar63 = *(undefined1 (*) [16])(uVar60 + 0x50 + lVar49);
          auVar90._16_16_ = auVar63;
          auVar90._0_16_ = auVar63;
          auVar63 = *(undefined1 (*) [16])(uVar60 + 0x90 + lVar49);
          auVar112._16_16_ = auVar63;
          auVar112._0_16_ = auVar63;
          auVar89 = *(undefined1 (*) [16])(uVar60 + 0xa0 + lVar49);
          auVar117._16_16_ = auVar89;
          auVar117._0_16_ = auVar89;
          auVar80 = *(undefined1 (*) [16])(uVar60 + 0xb0 + lVar49);
          auVar120._16_16_ = auVar80;
          auVar120._0_16_ = auVar80;
          auVar32 = vsubps_avx(auVar105,auVar64);
          auVar64 = vsubps_avx(auVar122,auVar83);
          auVar65 = vsubps_avx(auVar130,auVar90);
          auVar83 = vsubps_avx(auVar112,auVar105);
          auVar84 = vsubps_avx(auVar117,auVar122);
          auVar85 = vsubps_avx(auVar120,auVar130);
          fVar11 = auVar85._0_4_;
          fVar96 = auVar64._0_4_;
          fVar14 = auVar85._4_4_;
          fVar98 = auVar64._4_4_;
          auVar33._4_4_ = fVar98 * fVar14;
          auVar33._0_4_ = fVar96 * fVar11;
          fVar17 = auVar85._8_4_;
          fVar99 = auVar64._8_4_;
          auVar33._8_4_ = fVar99 * fVar17;
          fVar20 = auVar85._12_4_;
          fVar100 = auVar64._12_4_;
          auVar33._12_4_ = fVar100 * fVar20;
          fVar23 = auVar85._16_4_;
          fVar101 = auVar64._16_4_;
          auVar33._16_4_ = fVar101 * fVar23;
          fVar26 = auVar85._20_4_;
          fVar102 = auVar64._20_4_;
          auVar33._20_4_ = fVar102 * fVar26;
          fVar29 = auVar85._24_4_;
          fVar103 = auVar64._24_4_;
          uVar37 = auVar63._12_4_;
          auVar33._24_4_ = fVar103 * fVar29;
          auVar33._28_4_ = uVar37;
          fVar12 = auVar84._0_4_;
          fVar137 = auVar65._0_4_;
          fVar15 = auVar84._4_4_;
          fVar138 = auVar65._4_4_;
          auVar34._4_4_ = fVar138 * fVar15;
          auVar34._0_4_ = fVar137 * fVar12;
          fVar18 = auVar84._8_4_;
          fVar139 = auVar65._8_4_;
          auVar34._8_4_ = fVar139 * fVar18;
          fVar21 = auVar84._12_4_;
          fVar140 = auVar65._12_4_;
          auVar34._12_4_ = fVar140 * fVar21;
          fVar24 = auVar84._16_4_;
          fVar141 = auVar65._16_4_;
          auVar34._16_4_ = fVar141 * fVar24;
          fVar27 = auVar84._20_4_;
          fVar142 = auVar65._20_4_;
          auVar34._20_4_ = fVar142 * fVar27;
          fVar30 = auVar84._24_4_;
          fVar143 = auVar65._24_4_;
          auVar34._24_4_ = fVar143 * fVar30;
          auVar34._28_4_ = auVar89._12_4_;
          auVar65 = vsubps_avx(auVar34,auVar33);
          fVar13 = auVar83._0_4_;
          fVar16 = auVar83._4_4_;
          auVar35._4_4_ = fVar138 * fVar16;
          auVar35._0_4_ = fVar137 * fVar13;
          fVar19 = auVar83._8_4_;
          auVar35._8_4_ = fVar139 * fVar19;
          fVar22 = auVar83._12_4_;
          auVar35._12_4_ = fVar140 * fVar22;
          fVar25 = auVar83._16_4_;
          auVar35._16_4_ = fVar141 * fVar25;
          fVar28 = auVar83._20_4_;
          auVar35._20_4_ = fVar142 * fVar28;
          fVar31 = auVar83._24_4_;
          auVar35._24_4_ = fVar143 * fVar31;
          auVar35._28_4_ = uVar37;
          fVar62 = auVar32._0_4_;
          fVar67 = auVar32._4_4_;
          auVar36._4_4_ = fVar67 * fVar14;
          auVar36._0_4_ = fVar62 * fVar11;
          fVar69 = auVar32._8_4_;
          auVar36._8_4_ = fVar69 * fVar17;
          fVar71 = auVar32._12_4_;
          auVar36._12_4_ = fVar71 * fVar20;
          fVar73 = auVar32._16_4_;
          auVar36._16_4_ = fVar73 * fVar23;
          fVar75 = auVar32._20_4_;
          auVar36._20_4_ = fVar75 * fVar26;
          fVar77 = auVar32._24_4_;
          auVar36._24_4_ = fVar77 * fVar29;
          auVar36._28_4_ = auVar80._12_4_;
          auVar33 = vsubps_avx(auVar36,auVar35);
          auVar32._4_4_ = fVar67 * fVar15;
          auVar32._0_4_ = fVar62 * fVar12;
          auVar32._8_4_ = fVar69 * fVar18;
          auVar32._12_4_ = fVar71 * fVar21;
          auVar32._16_4_ = fVar73 * fVar24;
          auVar32._20_4_ = fVar75 * fVar27;
          auVar32._24_4_ = fVar77 * fVar30;
          auVar32._28_4_ = uVar37;
          auVar38._4_4_ = fVar98 * fVar16;
          auVar38._0_4_ = fVar96 * fVar13;
          auVar38._8_4_ = fVar99 * fVar19;
          auVar38._12_4_ = fVar100 * fVar22;
          auVar38._16_4_ = fVar101 * fVar25;
          auVar38._20_4_ = fVar102 * fVar28;
          auVar38._24_4_ = fVar103 * fVar31;
          auVar38._28_4_ = auVar64._28_4_;
          auVar34 = vsubps_avx(auVar38,auVar32);
          auVar46._4_4_ = uVar47;
          auVar46._0_4_ = uVar47;
          auVar46._8_4_ = uVar47;
          auVar46._12_4_ = uVar47;
          auVar46._16_4_ = uVar47;
          auVar46._20_4_ = uVar47;
          auVar46._24_4_ = uVar47;
          auVar46._28_4_ = uVar47;
          auVar32 = vsubps_avx(auVar105,auVar46);
          auVar45._4_4_ = uVar5;
          auVar45._0_4_ = uVar5;
          auVar45._8_4_ = uVar5;
          auVar45._12_4_ = uVar5;
          auVar45._16_4_ = uVar5;
          auVar45._20_4_ = uVar5;
          auVar45._24_4_ = uVar5;
          auVar45._28_4_ = uVar5;
          auVar35 = vsubps_avx(auVar122,auVar45);
          auVar44._4_4_ = uVar6;
          auVar44._0_4_ = uVar6;
          auVar44._8_4_ = uVar6;
          auVar44._12_4_ = uVar6;
          auVar44._16_4_ = uVar6;
          auVar44._20_4_ = uVar6;
          auVar44._24_4_ = uVar6;
          auVar44._28_4_ = uVar6;
          auVar36 = vsubps_avx(auVar130,auVar44);
          fVar129 = auVar36._0_4_;
          fVar131 = auVar36._4_4_;
          auVar39._4_4_ = fVar131 * fVar8;
          auVar39._0_4_ = fVar129 * fVar8;
          fVar132 = auVar36._8_4_;
          auVar39._8_4_ = fVar132 * fVar8;
          fVar133 = auVar36._12_4_;
          auVar39._12_4_ = fVar133 * fVar8;
          fVar134 = auVar36._16_4_;
          auVar39._16_4_ = fVar134 * fVar8;
          fVar135 = auVar36._20_4_;
          auVar39._20_4_ = fVar135 * fVar8;
          fVar136 = auVar36._24_4_;
          auVar39._24_4_ = fVar136 * fVar8;
          auVar39._28_4_ = auVar64._28_4_;
          fVar121 = auVar35._0_4_;
          auVar144._0_4_ = fVar121 * fVar9;
          fVar123 = auVar35._4_4_;
          auVar144._4_4_ = fVar123 * fVar9;
          fVar124 = auVar35._8_4_;
          auVar144._8_4_ = fVar124 * fVar9;
          fVar125 = auVar35._12_4_;
          auVar144._12_4_ = fVar125 * fVar9;
          fVar126 = auVar35._16_4_;
          auVar144._16_4_ = fVar126 * fVar9;
          fVar127 = auVar35._20_4_;
          auVar144._20_4_ = fVar127 * fVar9;
          fVar128 = auVar35._24_4_;
          auVar144._28_36_ = in_ZMM14._28_36_;
          auVar144._24_4_ = fVar128 * fVar9;
          auVar64 = vsubps_avx(auVar144._0_32_,auVar39);
          fVar104 = auVar32._0_4_;
          fVar106 = auVar32._4_4_;
          auVar40._4_4_ = fVar106 * fVar9;
          auVar40._0_4_ = fVar104 * fVar9;
          fVar107 = auVar32._8_4_;
          auVar40._8_4_ = fVar107 * fVar9;
          fVar108 = auVar32._12_4_;
          auVar40._12_4_ = fVar108 * fVar9;
          fVar109 = auVar32._16_4_;
          auVar40._16_4_ = fVar109 * fVar9;
          fVar110 = auVar32._20_4_;
          auVar40._20_4_ = fVar110 * fVar9;
          fVar111 = auVar32._24_4_;
          auVar40._24_4_ = fVar111 * fVar9;
          auVar40._28_4_ = in_ZMM14._28_4_;
          auVar145._0_4_ = fVar129 * fVar7;
          auVar145._4_4_ = fVar131 * fVar7;
          auVar145._8_4_ = fVar132 * fVar7;
          auVar145._12_4_ = fVar133 * fVar7;
          auVar145._16_4_ = fVar134 * fVar7;
          auVar145._20_4_ = fVar135 * fVar7;
          auVar145._28_36_ = in_ZMM15._28_36_;
          auVar145._24_4_ = fVar136 * fVar7;
          auVar35 = vsubps_avx(auVar145._0_32_,auVar40);
          in_ZMM14 = ZEXT3264(auVar35);
          auVar41._4_4_ = fVar123 * fVar7;
          auVar41._0_4_ = fVar121 * fVar7;
          auVar41._8_4_ = fVar124 * fVar7;
          auVar41._12_4_ = fVar125 * fVar7;
          auVar41._16_4_ = fVar126 * fVar7;
          auVar41._20_4_ = fVar127 * fVar7;
          fVar91 = in_ZMM15._28_4_;
          auVar41._24_4_ = fVar128 * fVar7;
          auVar41._28_4_ = fVar91;
          auVar114._0_4_ = fVar8 * fVar104;
          auVar114._4_4_ = fVar8 * fVar106;
          auVar114._8_4_ = fVar8 * fVar107;
          auVar114._12_4_ = fVar8 * fVar108;
          auVar114._16_4_ = fVar8 * fVar109;
          auVar114._20_4_ = fVar8 * fVar110;
          auVar114._28_36_ = auVar115._28_36_;
          auVar114._24_4_ = fVar8 * fVar111;
          auVar36 = vsubps_avx(auVar114._0_32_,auVar41);
          auVar115 = ZEXT3264(auVar36);
          local_920 = auVar65._0_4_;
          fStack_91c = auVar65._4_4_;
          fStack_918 = auVar65._8_4_;
          fStack_914 = auVar65._12_4_;
          fStack_910 = auVar65._16_4_;
          fStack_90c = auVar65._20_4_;
          fStack_908 = auVar65._24_4_;
          in_ZMM15 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar7 * fStack_908,
                                                         CONCAT420(fVar7 * fStack_90c,
                                                                   CONCAT416(fVar7 * fStack_910,
                                                                             CONCAT412(fVar7 * 
                                                  fStack_914,
                                                  CONCAT48(fVar7 * fStack_918,
                                                           CONCAT44(fVar7 * fStack_91c,
                                                                    fVar7 * local_920))))))));
          auVar118._0_4_ = fVar7 * local_920 + fVar8 * auVar33._0_4_ + auVar34._0_4_ * fVar9;
          auVar118._4_4_ = fVar7 * fStack_91c + fVar8 * auVar33._4_4_ + auVar34._4_4_ * fVar9;
          auVar118._8_4_ = fVar7 * fStack_918 + fVar8 * auVar33._8_4_ + auVar34._8_4_ * fVar9;
          auVar118._12_4_ = fVar7 * fStack_914 + fVar8 * auVar33._12_4_ + auVar34._12_4_ * fVar9;
          auVar118._16_4_ = fVar7 * fStack_910 + fVar8 * auVar33._16_4_ + auVar34._16_4_ * fVar9;
          auVar118._20_4_ = fVar7 * fStack_90c + fVar8 * auVar33._20_4_ + auVar34._20_4_ * fVar9;
          auVar118._24_4_ = fVar7 * fStack_908 + fVar8 * auVar33._24_4_ + auVar34._24_4_ * fVar9;
          auVar118._28_4_ = fVar91 + fVar8 + fVar91;
          fVar91 = auVar83._28_4_ + auVar85._28_4_ + auVar84._28_4_;
          auVar65._8_4_ = 0x80000000;
          auVar65._0_8_ = 0x8000000080000000;
          auVar65._12_4_ = 0x80000000;
          auVar65._16_4_ = 0x80000000;
          auVar65._20_4_ = 0x80000000;
          auVar65._24_4_ = 0x80000000;
          auVar65._28_4_ = 0x80000000;
          auVar32 = vandps_avx(auVar118,auVar65);
          uVar48 = auVar32._0_4_;
          auVar93._0_4_ =
               (float)(uVar48 ^ (uint)(fVar13 * auVar64._0_4_ +
                                      auVar36._0_4_ * fVar11 + auVar35._0_4_ * fVar12));
          uVar68 = auVar32._4_4_;
          auVar93._4_4_ =
               (float)(uVar68 ^ (uint)(fVar16 * auVar64._4_4_ +
                                      auVar36._4_4_ * fVar14 + auVar35._4_4_ * fVar15));
          uVar70 = auVar32._8_4_;
          auVar93._8_4_ =
               (float)(uVar70 ^ (uint)(fVar19 * auVar64._8_4_ +
                                      auVar36._8_4_ * fVar17 + auVar35._8_4_ * fVar18));
          uVar72 = auVar32._12_4_;
          auVar93._12_4_ =
               (float)(uVar72 ^ (uint)(fVar22 * auVar64._12_4_ +
                                      auVar36._12_4_ * fVar20 + auVar35._12_4_ * fVar21));
          uVar74 = auVar32._16_4_;
          auVar93._16_4_ =
               (float)(uVar74 ^ (uint)(fVar25 * auVar64._16_4_ +
                                      auVar36._16_4_ * fVar23 + auVar35._16_4_ * fVar24));
          uVar76 = auVar32._20_4_;
          auVar93._20_4_ =
               (float)(uVar76 ^ (uint)(fVar28 * auVar64._20_4_ +
                                      auVar36._20_4_ * fVar26 + auVar35._20_4_ * fVar27));
          uVar78 = auVar32._24_4_;
          auVar93._24_4_ =
               (float)(uVar78 ^ (uint)(fVar31 * auVar64._24_4_ +
                                      auVar36._24_4_ * fVar29 + auVar35._24_4_ * fVar30));
          uVar79 = auVar32._28_4_;
          auVar93._28_4_ = (float)(uVar79 ^ (uint)fVar91);
          auVar84._0_4_ =
               (float)(uVar48 ^ (uint)(auVar64._0_4_ * fVar62 +
                                      fVar137 * auVar36._0_4_ + auVar35._0_4_ * fVar96));
          auVar84._4_4_ =
               (float)(uVar68 ^ (uint)(auVar64._4_4_ * fVar67 +
                                      fVar138 * auVar36._4_4_ + auVar35._4_4_ * fVar98));
          auVar84._8_4_ =
               (float)(uVar70 ^ (uint)(auVar64._8_4_ * fVar69 +
                                      fVar139 * auVar36._8_4_ + auVar35._8_4_ * fVar99));
          auVar84._12_4_ =
               (float)(uVar72 ^ (uint)(auVar64._12_4_ * fVar71 +
                                      fVar140 * auVar36._12_4_ + auVar35._12_4_ * fVar100));
          auVar84._16_4_ =
               (float)(uVar74 ^ (uint)(auVar64._16_4_ * fVar73 +
                                      fVar141 * auVar36._16_4_ + auVar35._16_4_ * fVar101));
          auVar84._20_4_ =
               (float)(uVar76 ^ (uint)(auVar64._20_4_ * fVar75 +
                                      fVar142 * auVar36._20_4_ + auVar35._20_4_ * fVar102));
          auVar84._24_4_ =
               (float)(uVar78 ^ (uint)(auVar64._24_4_ * fVar77 +
                                      fVar143 * auVar36._24_4_ + auVar35._24_4_ * fVar103));
          auVar84._28_4_ = (float)(uVar79 ^ (uint)(fVar91 + auVar33._28_4_ + auVar34._28_4_));
          auVar32 = vcmpps_avx(auVar93,ZEXT832(0) << 0x20,5);
          auVar64 = vcmpps_avx(auVar84,ZEXT832(0) << 0x20,5);
          auVar32 = vandps_avx(auVar32,auVar64);
          auVar65 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,4);
          auVar32 = vandps_avx(auVar32,auVar65);
          auVar94._0_4_ = auVar93._0_4_ + auVar84._0_4_;
          auVar94._4_4_ = auVar93._4_4_ + auVar84._4_4_;
          auVar94._8_4_ = auVar93._8_4_ + auVar84._8_4_;
          auVar94._12_4_ = auVar93._12_4_ + auVar84._12_4_;
          auVar94._16_4_ = auVar93._16_4_ + auVar84._16_4_;
          auVar94._20_4_ = auVar93._20_4_ + auVar84._20_4_;
          auVar94._24_4_ = auVar93._24_4_ + auVar84._24_4_;
          auVar94._28_4_ = auVar93._28_4_ + auVar84._28_4_;
          auVar85._8_4_ = 0x7fffffff;
          auVar85._0_8_ = 0x7fffffff7fffffff;
          auVar85._12_4_ = 0x7fffffff;
          auVar85._16_4_ = 0x7fffffff;
          auVar85._20_4_ = 0x7fffffff;
          auVar85._24_4_ = 0x7fffffff;
          auVar85._28_4_ = 0x7fffffff;
          auVar64 = vandps_avx(auVar118,auVar85);
          auVar83 = vcmpps_avx(auVar94,auVar64,2);
          auVar84 = auVar83 & auVar32;
          if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar84 >> 0x7f,0) != '\0') ||
                (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar84 >> 0xbf,0) != '\0') ||
              (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar84[0x1f] < '\0') {
            auVar32 = vandps_avx(auVar83,auVar32);
            auVar63 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
            auVar66._0_4_ =
                 uVar48 ^ (uint)(local_920 * fVar104 +
                                fVar121 * auVar33._0_4_ + fVar129 * auVar34._0_4_);
            auVar66._4_4_ =
                 uVar68 ^ (uint)(fStack_91c * fVar106 +
                                fVar123 * auVar33._4_4_ + fVar131 * auVar34._4_4_);
            auVar66._8_4_ =
                 uVar70 ^ (uint)(fStack_918 * fVar107 +
                                fVar124 * auVar33._8_4_ + fVar132 * auVar34._8_4_);
            auVar66._12_4_ =
                 uVar72 ^ (uint)(fStack_914 * fVar108 +
                                fVar125 * auVar33._12_4_ + fVar133 * auVar34._12_4_);
            auVar66._16_4_ =
                 uVar74 ^ (uint)(fStack_910 * fVar109 +
                                fVar126 * auVar33._16_4_ + fVar134 * auVar34._16_4_);
            auVar66._20_4_ =
                 uVar76 ^ (uint)(fStack_90c * fVar110 +
                                fVar127 * auVar33._20_4_ + fVar135 * auVar34._20_4_);
            auVar66._24_4_ =
                 uVar78 ^ (uint)(fStack_908 * fVar111 +
                                fVar128 * auVar33._24_4_ + fVar136 * auVar34._24_4_);
            auVar66._28_4_ = uVar79 ^ (uint)(auVar65._28_4_ + auVar65._28_4_ + 0.0);
            fVar11 = *(float *)(ray + k * 4 + 0x60);
            auVar42._4_4_ = auVar64._4_4_ * fVar11;
            auVar42._0_4_ = auVar64._0_4_ * fVar11;
            auVar42._8_4_ = auVar64._8_4_ * fVar11;
            auVar42._12_4_ = auVar64._12_4_ * fVar11;
            auVar42._16_4_ = auVar64._16_4_ * fVar11;
            auVar42._20_4_ = auVar64._20_4_ * fVar11;
            auVar42._24_4_ = auVar64._24_4_ * fVar11;
            auVar42._28_4_ = fVar11;
            auVar32 = vcmpps_avx(auVar42,auVar66,1);
            fVar11 = *(float *)(ray + k * 4 + 0x100);
            auVar43._4_4_ = auVar64._4_4_ * fVar11;
            auVar43._0_4_ = auVar64._0_4_ * fVar11;
            auVar43._8_4_ = auVar64._8_4_ * fVar11;
            auVar43._12_4_ = auVar64._12_4_ * fVar11;
            auVar43._16_4_ = auVar64._16_4_ * fVar11;
            auVar43._20_4_ = auVar64._20_4_ * fVar11;
            auVar43._24_4_ = auVar64._24_4_ * fVar11;
            auVar43._28_4_ = auVar64._28_4_;
            auVar64 = vcmpps_avx(auVar66,auVar43,2);
            auVar32 = vandps_avx(auVar32,auVar64);
            auVar89 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
            auVar63 = vpand_avx(auVar89,auVar63);
            auVar89 = vpmovzxwd_avx(auVar63);
            auVar86._0_16_ = vpslld_avx(auVar89,0x1f);
            auVar89 = vpunpckhwd_avx(auVar63,auVar63);
            auVar89 = vpslld_avx(auVar89,0x1f);
            auVar86._16_16_ = auVar89;
            if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar86 >> 0x7f,0) != '\0') ||
                  (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar89 >> 0x3f,0) != '\0') ||
                (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar89[0xf] < '\0') {
              auVar63 = vpsllw_avx(auVar63,0xf);
              auVar63 = vpacksswb_avx(auVar63,auVar63);
              uVar53 = (ulong)(byte)(SUB161(auVar63 >> 7,0) & 1 |
                                     (SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar63 >> 0x3f,0) << 7);
              do {
                uVar10 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                uVar48 = *(uint *)(ray + k * 4 + 0x120) &
                         ((context->scene->geometries).items
                          [*(uint *)((long)&local_820 + uVar10 * 4)].ptr)->mask;
                if (uVar48 == 0) {
                  uVar53 = uVar53 ^ 1L << (uVar10 & 0x3f);
                }
                auVar115 = ZEXT1664(auVar113);
                if (uVar48 != 0) {
                  if (bVar61) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar57 = 1;
                  }
                  goto LAB_003d9d58;
                }
              } while (uVar53 != 0);
            }
          }
          uVar59 = uVar59 + 1;
          bVar61 = uVar59 < uVar58;
        } while (uVar59 != uVar58);
      }
    }
LAB_003d9d58:
  } while ((uVar57 & 3) == 0);
  return puVar51 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }